

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O0

int Cortex_SendHtr(sHierarchy *pHierarchy,tSegmentData *pFrame)

{
  short sVar1;
  int iVar2;
  int iVar3;
  void *in_RSI;
  sHierarchy *in_RDI;
  int nBytesFrame;
  int nBytesHierarchy;
  char *Ptr;
  unsigned_short *Header;
  char *pcVar4;
  int local_4;
  
  pcVar4 = Cortex_SendHtr::BigArray;
  iVar2 = PackHierarchy(in_RDI,in_RSI,0);
  iVar3 = in_RDI->nSegments * 0x38 + 4;
  memcpy(Cortex_SendHtr::BigArray + (long)iVar2 + 8,in_RSI,(long)iVar3);
  pcVar4[0] = '\x11';
  pcVar4[1] = '\0';
  sVar1 = (short)iVar3;
  *(short *)(pcVar4 + 2) = (short)iVar2 + 4 + sVar1;
  *(short *)(pcVar4 + 4) = (short)iVar2;
  *(short *)(pcVar4 + 6) = sVar1;
  iVar2 = SendToCortex((sPacket *)0x10715d);
  if (iVar2 == 0) {
    local_4 = 0;
  }
  else {
    local_4 = 3;
  }
  return local_4;
}

Assistant:

int Cortex_SendHtr(sHierarchy *pHierarchy, tSegmentData *pFrame)
{
  static char BigArray[0x20000];
  unsigned short *Header = &((unsigned short *) BigArray)[0];
  char *Ptr = &BigArray[8];
  int nBytesHierarchy = 0;
  int nBytesFrame = 0;

  // Packet ID        - 2 bytes
  // Packet DataSize  - 2 bytes
  // nBytesHierachy   - 2 bytes
  // nBytesDataFrame  - 2 bytes

#if 1
  Ptr = &BigArray[8];
  nBytesHierarchy = PackHierarchy(pHierarchy, Ptr, 0x20000);
  Ptr += nBytesHierarchy;
#endif

  nBytesFrame = sizeof(int) + pHierarchy->nSegments * 7 * sizeof(double);
  memcpy(Ptr, pFrame, nBytesFrame);

  Header[0] = PKT2_PUSH_BASEPOSITION;
  Header[1] = 4 + nBytesHierarchy + nBytesFrame;
  Header[2] = nBytesHierarchy;
  Header[3] = nBytesFrame;

  if (SendToCortex((sPacket *) BigArray) != 0) {
    return RC_NetworkError;
  }

  return 0;
}